

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

Options * parseOptions(Options *__return_storage_ptr__,int argc,char **argv)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  int iVar1;
  ostream *poVar2;
  int argc_00;
  Options *pOVar3;
  long lVar4;
  allocator local_71;
  Options *local_70;
  int local_64;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  set<int,_std::less<int>,_std::allocator<int>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Options::Options(__return_storage_ptr__);
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &__return_storage_ptr__->publish;
  local_58 = &__return_storage_ptr__->vcids;
  local_70 = __return_storage_ptr__;
  local_64 = argc;
  do {
    argc_00 = argc;
    iVar1 = getopt_long(argc,argv,"",parseOptions::longOpts,0);
    pOVar3 = (Options *)&__return_storage_ptr__->filename;
    switch(iVar1) {
    case 0x1001:
      pOVar3 = local_70;
    case 0x1005:
      std::__cxx11::string::assign((char *)pOVar3);
      break;
    case 0x1002:
      local_50._M_dataplus._M_p._0_4_ = atoi(_optarg);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_58->_M_t,(int *)&local_50);
      break;
    case 0x1003:
      std::__cxx11::string::string((string *)&local_50,_optarg,&local_71);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_60,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      argc = local_64;
      break;
    case 0x1004:
      local_70->record = true;
      break;
    default:
      if (iVar1 != 0) {
        if (iVar1 == -1) {
          this = &local_70->files;
          for (lVar4 = (long)_optind; lVar4 < argc; lVar4 = lVar4 + 1) {
            std::__cxx11::string::string((string *)&local_50,argv[lVar4],&local_71);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                       &local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          return local_70;
        }
        if (iVar1 == 0x1337) {
          usage(argc_00,argv);
        }
        else if (iVar1 == 0x1338) {
          version(local_64,argv);
          exit(0);
        }
        poVar2 = std::operator<<((ostream *)&std::cerr,"Invalid option");
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
  } while( true );
}

Assistant:

Options parseOptions(int argc, char** argv) {
  Options opts;

  while (1) {
    static struct option longOpts[] = {
      {"subscribe", required_argument, 0,       0x1001},
      {"vcid",      required_argument, 0,       0x1002},
      {"publish",   required_argument, 0,       0x1003},
      {"record" ,   no_argument,       0,       0x1004},
      {"filename" , required_argument, 0,       0x1005},
      {"help",      no_argument,       nullptr, 0x1337},
      {"version",   no_argument,       nullptr, 0x1338},
      {nullptr,     0,                 nullptr, 0},
    };

    auto c = getopt_long(argc, argv, "", longOpts, nullptr);
    if (c == -1) {
      break;
    }

    switch (c) {
    case 0:
      break;
    case 0x1001:
      opts.subscribe = optarg;
      break;
    case 0x1002:
      opts.vcids.insert(atoi(optarg));
      break;
    case 0x1003:
      opts.publish.push_back(optarg);
      break;
    case 0x1004:
      opts.record = true;
      break;
    case 0x1005:
      opts.filename = optarg;
      break;
    case 0x1337:
      usage(argc, argv);
      break;
    case 0x1338:
      version(argc, argv);
      exit(0);
      break;
    default:
      std::cerr << "Invalid option" << std::endl;
      exit(1);
    }
  }

  for (int i = optind; i < argc; i++) {
    opts.files.push_back(argv[i]);
  }

  return opts;
}